

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void slang::ast::builtins::registerNonConstFuncs(Compilation *c)

{
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  pointer __args_2;
  Type *pTVar1;
  Type *pTVar2;
  unique_ptr<slang::ast::builtins::RandModeFunc,_std::default_delete<slang::ast::builtins::RandModeFunc>_>
  local_5c0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_5b8;
  unique_ptr<slang::ast::builtins::RandModeFunc,_std::default_delete<slang::ast::builtins::RandModeFunc>_>
  local_5b0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_5a8;
  undefined1 local_599;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_598;
  undefined1 local_57c [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_570;
  unique_ptr<slang::ast::builtins::PastFunc,_std::default_delete<slang::ast::builtins::PastFunc>_>
  local_568;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_560;
  unique_ptr<slang::ast::builtins::SampledFunc,_std::default_delete<slang::ast::builtins::SampledFunc>_>
  local_558;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_550;
  unique_ptr<slang::ast::builtins::FReadFunc,_std::default_delete<slang::ast::builtins::FReadFunc>_>
  local_548;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_540;
  undefined1 local_531;
  unique_ptr<slang::ast::builtins::ScanfFunc,_std::default_delete<slang::ast::builtins::ScanfFunc>_>
  local_530;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_528;
  undefined1 local_519;
  unique_ptr<slang::ast::builtins::ScanfFunc,_std::default_delete<slang::ast::builtins::ScanfFunc>_>
  local_518;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_510;
  unique_ptr<slang::ast::builtins::FGetsFunc,_std::default_delete<slang::ast::builtins::FGetsFunc>_>
  local_508;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_500;
  unique_ptr<slang::ast::builtins::FErrorFunc,_std::default_delete<slang::ast::builtins::FErrorFunc>_>
  local_4f8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_4f0;
  undefined1 local_4e1;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_4e0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_4d8;
  undefined1 local_4c9;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_4c8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_4c0;
  undefined1 local_4b1;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_4b0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_4a8;
  undefined1 local_499;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_498;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_490;
  undefined1 local_481;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_480;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_478;
  undefined1 local_469;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_468;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_460;
  undefined1 local_451;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_450;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_448;
  undefined1 local_439;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_438;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_430;
  undefined1 local_421;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_420;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_418;
  undefined1 local_409;
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  local_408;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_400;
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  local_3f8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_3f0;
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  local_3e8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_3e0;
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  local_3d8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_3d0;
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  local_3c8;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_3c0;
  undefined4 local_3b4;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_3b0;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_3a8;
  undefined4 local_39c;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_398;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_390;
  undefined4 local_384;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_380;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_378;
  undefined4 local_36c;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_368;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_360;
  undefined4 local_354;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_350;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_348;
  undefined4 local_33c;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_338;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_330;
  undefined4 local_324;
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  local_320;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_318;
  allocator<const_slang::ast::Type_*> local_309;
  Type *local_308;
  iterator local_300;
  size_type local_2f8;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_2f0;
  undefined1 local_2d4 [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_2c8;
  undefined1 local_2bc [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_2b0;
  undefined1 local_2a4 [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_298;
  undefined1 local_28c [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_280;
  allocator<const_slang::ast::Type_*> local_271;
  Type *local_270;
  Type *local_268;
  Type *local_260;
  iterator local_258;
  size_type local_250;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_248;
  undefined1 local_22c [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_220;
  undefined1 local_214 [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_208;
  allocator<const_slang::ast::Type_*> local_1f9;
  Type *local_1f8;
  Type *local_1f0;
  iterator local_1e8;
  size_type local_1e0;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_1d8;
  undefined1 local_1bc [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_1b0;
  undefined1 local_1a4 [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_198;
  undefined1 local_18c [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_180;
  allocator<const_slang::ast::Type_*> local_171;
  Type *local_170;
  Type *local_168;
  iterator local_160;
  size_type local_158;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_150;
  undefined1 local_134 [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_128;
  allocator<const_slang::ast::Type_*> local_119;
  Type *local_118;
  pointer local_110;
  iterator local_108;
  size_type local_100;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_f8;
  undefined1 local_dc [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_d0;
  undefined1 local_c4 [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_b8;
  undefined1 local_ac [12];
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_a0;
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  local_98;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_90;
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  local_88;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_80;
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  local_78;
  unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_70 [3];
  allocator<const_slang::ast::Type_*> local_51;
  Type *local_50;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> intArg;
  Type *uintType;
  Type *intType;
  Compilation *c_local;
  
  pTVar1 = Compilation::getIntType(c);
  intArg.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Compilation::getUnsignedIntType(c);
  local_48 = &local_50;
  local_40 = 1;
  local_50 = pTVar1;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_51);
  __l_04._M_len = local_40;
  __l_04._M_array = local_48;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_38
             ,__l_04,&local_51);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_51);
  Compilation::getType(c,TimeType);
  std::make_unique<slang::ast::NonConstantFunction,char_const(&)[6],slang::ast::Type_const&>
            ((char (*) [6])&local_78,(Type *)"$time");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)local_70,&local_78);
  Compilation::addSystemSubroutine(c,local_70);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(local_70);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr(&local_78);
  Compilation::getUnsignedIntType(c);
  std::make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&>
            ((char (*) [7])&local_88,(Type *)"$stime");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_80,&local_88);
  Compilation::addSystemSubroutine(c,&local_80);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_80);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr(&local_88);
  Compilation::getType(c,RealTimeType);
  std::make_unique<slang::ast::NonConstantFunction,char_const(&)[10],slang::ast::Type_const&>
            ((char (*) [10])&local_98,(Type *)"$realtime");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_90,&local_98);
  Compilation::addSystemSubroutine(c,&local_90);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_90);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr(&local_98);
  local_ac._0_4_ = 0;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])(local_ac + 4),(Type *)"$random",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_ac
            );
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_a0,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_ac + 4));
  Compilation::addSystemSubroutine(c,&local_a0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_a0);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_ac + 4));
  local_c4._0_4_ = 0;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[9],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [9])(local_c4 + 4),(Type *)"$urandom",
             (int *)intArg.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_c4
            );
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_b8,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_c4 + 4));
  Compilation::addSystemSubroutine(c,&local_b8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_b8);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_c4 + 4));
  __args_2 = intArg.
             super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_dc._0_4_ = 1;
  local_118 = (Type *)intArg.
                      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_110 = intArg.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108 = &local_118;
  local_100 = 2;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_119);
  __l_03._M_len = local_100;
  __l_03._M_array = local_108;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_f8,__l_03,&local_119);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[15],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [15])(local_dc + 4),(Type *)"$urandom_range",(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_dc
            );
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_d0,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_dc + 4));
  Compilation::addSystemSubroutine(c,&local_d0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_d0);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_dc + 4));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_f8);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_119);
  local_134._0_4_ = 1;
  local_170 = Compilation::getStringType(c);
  local_168 = Compilation::getStringType(c);
  local_160 = &local_170;
  local_158 = 2;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_171);
  __l_02._M_len = local_158;
  __l_02._M_array = local_160;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_150,__l_02,&local_171);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [7])(local_134 + 4),(Type *)"$fopen",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_134);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_128,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_134 + 4));
  Compilation::addSystemSubroutine(c,&local_128);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_128);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_134 + 4));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_150);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_171);
  pTVar2 = Compilation::getVoidType(c);
  local_18c._0_4_ = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])(local_18c + 4),(Type *)"$fclose",(int *)pTVar2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_18c);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_180,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_18c + 4));
  Compilation::addSystemSubroutine(c,&local_180);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_180);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_18c + 4));
  local_1a4._0_4_ = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [7])(local_1a4 + 4),(Type *)"$fgetc",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_1a4);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_198,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_1a4 + 4));
  Compilation::addSystemSubroutine(c,&local_198);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_198);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_1a4 + 4));
  local_1bc._0_4_ = 2;
  local_1e8 = &local_1f8;
  local_1e0 = 2;
  local_1f8 = pTVar1;
  local_1f0 = pTVar1;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_1f9);
  __l_01._M_len = local_1e0;
  __l_01._M_array = local_1e8;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_1d8,__l_01,&local_1f9);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [8])(local_1bc + 4),(Type *)"$ungetc",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_1bc);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_1b0,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_1bc + 4));
  Compilation::addSystemSubroutine(c,&local_1b0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_1b0);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_1bc + 4));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_1d8);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_1f9);
  local_214._0_4_ = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [7])(local_214 + 4),(Type *)"$ftell",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_214);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_208,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_214 + 4));
  Compilation::addSystemSubroutine(c,&local_208);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_208);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_214 + 4));
  local_22c._0_4_ = 3;
  local_258 = &local_270;
  local_250 = 3;
  local_270 = pTVar1;
  local_268 = pTVar1;
  local_260 = pTVar1;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_271);
  __l_00._M_len = local_250;
  __l_00._M_array = local_258;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_248,__l_00,&local_271);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [7])(local_22c + 4),(Type *)"$fseek",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_22c);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_220,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_22c + 4));
  Compilation::addSystemSubroutine(c,&local_220);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_220);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_22c + 4));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_248);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_271);
  local_28c._0_4_ = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])(local_28c + 4),(Type *)"$rewind",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_28c);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_280,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_28c + 4));
  Compilation::addSystemSubroutine(c,&local_280);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_280);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_28c + 4));
  pTVar2 = Compilation::getVoidType(c);
  local_2a4._0_4_ = 0;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])(local_2a4 + 4),(Type *)"$fflush",(int *)pTVar2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_2a4);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_298,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_2a4 + 4));
  Compilation::addSystemSubroutine(c,&local_298);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_298);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_2a4 + 4));
  local_2bc._0_4_ = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[6],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [6])(local_2bc + 4),(Type *)"$feof",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_2bc);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_2b0,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_2bc + 4));
  Compilation::addSystemSubroutine(c,&local_2b0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_2b0);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_2bc + 4));
  local_2d4._0_4_ = 1;
  local_308 = Compilation::getStringType(c);
  local_300 = &local_308;
  local_2f8 = 1;
  std::allocator<const_slang::ast::Type_*>::allocator(&local_309);
  __l._M_len = local_2f8;
  __l._M_array = local_300;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_2f0,__l,&local_309);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[15],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [15])(local_2d4 + 4),(Type *)"$test$plusargs",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_2d4);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_2c8,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_2d4 + 4));
  Compilation::addSystemSubroutine(c,&local_2c8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_2c8);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_2d4 + 4));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_2f0);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_309);
  local_324 = 3;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[14],int>
            ((char (*) [14])&local_320,(int *)"$dist_uniform");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_318,&local_320);
  Compilation::addSystemSubroutine(c,&local_318);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_318);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_320);
  local_33c = 3;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[13],int>
            ((char (*) [13])&local_338,(int *)"$dist_normal");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_330,&local_338);
  Compilation::addSystemSubroutine(c,&local_330);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_330);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_338);
  local_354 = 2;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[18],int>
            ((char (*) [18])&local_350,(int *)"$dist_exponential");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_348,&local_350);
  Compilation::addSystemSubroutine(c,&local_348);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_348);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_350);
  local_36c = 2;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[14],int>
            ((char (*) [14])&local_368,(int *)"$dist_poisson");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_360,&local_368);
  Compilation::addSystemSubroutine(c,&local_360);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_360);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_368);
  local_384 = 2;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[17],int>
            ((char (*) [17])&local_380,(int *)"$dist_chi_square");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_378,&local_380);
  Compilation::addSystemSubroutine(c,&local_378);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_378);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_380);
  local_39c = 2;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[8],int>
            ((char (*) [8])&local_398,(int *)"$dist_t");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_390,&local_398);
  Compilation::addSystemSubroutine(c,&local_390);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_390);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_398);
  local_3b4 = 3;
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[13],int>
            ((char (*) [13])&local_3b0,(int *)"$dist_erlang");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::DistributionFunc,std::default_delete<slang::ast::builtins::DistributionFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_3a8,&local_3b0);
  Compilation::addSystemSubroutine(c,&local_3a8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_3a8);
  std::
  unique_ptr<slang::ast::builtins::DistributionFunc,_std::default_delete<slang::ast::builtins::DistributionFunc>_>
  ::~unique_ptr(&local_3b0);
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[6]>((char (*) [6])&local_3c8)
  ;
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,std::default_delete<slang::ast::builtins::ValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_3c0,&local_3c8);
  Compilation::addSystemSubroutine(c,&local_3c0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_3c0);
  std::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  ::~unique_ptr(&local_3c8);
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[6]>((char (*) [6])&local_3d8)
  ;
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,std::default_delete<slang::ast::builtins::ValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_3d0,&local_3d8);
  Compilation::addSystemSubroutine(c,&local_3d0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_3d0);
  std::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  ::~unique_ptr(&local_3d8);
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[8]>((char (*) [8])&local_3e8)
  ;
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,std::default_delete<slang::ast::builtins::ValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_3e0,&local_3e8);
  Compilation::addSystemSubroutine(c,&local_3e0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_3e0);
  std::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  ::~unique_ptr(&local_3e8);
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[9]>((char (*) [9])&local_3f8)
  ;
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,std::default_delete<slang::ast::builtins::ValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_3f0,&local_3f8);
  Compilation::addSystemSubroutine(c,&local_3f0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_3f0);
  std::
  unique_ptr<slang::ast::builtins::ValueChangeFunc,_std::default_delete<slang::ast::builtins::ValueChangeFunc>_>
  ::~unique_ptr(&local_3f8);
  local_409 = 0;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[11],bool>
            ((char (*) [11])&local_408,(bool *)"$past_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_400,&local_408);
  Compilation::addSystemSubroutine(c,&local_400);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_400);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_408);
  local_421 = 0;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[11],bool>
            ((char (*) [11])&local_420,(bool *)"$rose_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_418,&local_420);
  Compilation::addSystemSubroutine(c,&local_418);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_418);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_420);
  local_439 = 0;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[11],bool>
            ((char (*) [11])&local_438,(bool *)"$fell_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_430,&local_438);
  Compilation::addSystemSubroutine(c,&local_430);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_430);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_438);
  local_451 = 0;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_450,(bool *)"$stable_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_448,&local_450);
  Compilation::addSystemSubroutine(c,&local_448);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_448);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_450);
  local_469 = 0;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[14],bool>
            ((char (*) [14])&local_468,(bool *)"$changed_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_460,&local_468);
  Compilation::addSystemSubroutine(c,&local_460);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_460);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_468);
  local_481 = 1;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_480,(bool *)"$future_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_478,&local_480);
  Compilation::addSystemSubroutine(c,&local_478);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_478);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_480);
  local_499 = 1;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_498,(bool *)"$rising_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_490,&local_498);
  Compilation::addSystemSubroutine(c,&local_490);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_490);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_498);
  local_4b1 = 1;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[14],bool>
            ((char (*) [14])&local_4b0,(bool *)"$falling_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_4a8,&local_4b0);
  Compilation::addSystemSubroutine(c,&local_4a8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_4a8);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_4b0);
  local_4c9 = 1;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_4c8,(bool *)"$steady_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_4c0,&local_4c8);
  Compilation::addSystemSubroutine(c,&local_4c0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_4c0);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_4c8);
  local_4e1 = 1;
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[15],bool>
            ((char (*) [15])&local_4e0,(bool *)"$changing_gclk");
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_4d8,&local_4e0);
  Compilation::addSystemSubroutine(c,&local_4d8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_4d8);
  std::
  unique_ptr<slang::ast::builtins::GlobalValueChangeFunc,_std::default_delete<slang::ast::builtins::GlobalValueChangeFunc>_>
  ::~unique_ptr(&local_4e0);
  std::make_unique<slang::ast::builtins::FErrorFunc>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::FErrorFunc,std::default_delete<slang::ast::builtins::FErrorFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_4f0,&local_4f8);
  Compilation::addSystemSubroutine(c,&local_4f0);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_4f0);
  std::
  unique_ptr<slang::ast::builtins::FErrorFunc,_std::default_delete<slang::ast::builtins::FErrorFunc>_>
  ::~unique_ptr(&local_4f8);
  std::make_unique<slang::ast::builtins::FGetsFunc>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::FGetsFunc,std::default_delete<slang::ast::builtins::FGetsFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_500,&local_508);
  Compilation::addSystemSubroutine(c,&local_500);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_500);
  std::
  unique_ptr<slang::ast::builtins::FGetsFunc,_std::default_delete<slang::ast::builtins::FGetsFunc>_>
  ::~unique_ptr(&local_508);
  local_519 = 1;
  std::make_unique<slang::ast::builtins::ScanfFunc,bool>((bool *)&local_518);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ScanfFunc,std::default_delete<slang::ast::builtins::ScanfFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_510,&local_518);
  Compilation::addSystemSubroutine(c,&local_510);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_510);
  std::
  unique_ptr<slang::ast::builtins::ScanfFunc,_std::default_delete<slang::ast::builtins::ScanfFunc>_>
  ::~unique_ptr(&local_518);
  local_531 = 0;
  std::make_unique<slang::ast::builtins::ScanfFunc,bool>((bool *)&local_530);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::ScanfFunc,std::default_delete<slang::ast::builtins::ScanfFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_528,&local_530);
  Compilation::addSystemSubroutine(c,&local_528);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_528);
  std::
  unique_ptr<slang::ast::builtins::ScanfFunc,_std::default_delete<slang::ast::builtins::ScanfFunc>_>
  ::~unique_ptr(&local_530);
  std::make_unique<slang::ast::builtins::FReadFunc>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::FReadFunc,std::default_delete<slang::ast::builtins::FReadFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_540,&local_548);
  Compilation::addSystemSubroutine(c,&local_540);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_540);
  std::
  unique_ptr<slang::ast::builtins::FReadFunc,_std::default_delete<slang::ast::builtins::FReadFunc>_>
  ::~unique_ptr(&local_548);
  std::make_unique<slang::ast::builtins::SampledFunc>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::SampledFunc,std::default_delete<slang::ast::builtins::SampledFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_550,&local_558);
  Compilation::addSystemSubroutine(c,&local_550);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_550);
  std::
  unique_ptr<slang::ast::builtins::SampledFunc,_std::default_delete<slang::ast::builtins::SampledFunc>_>
  ::~unique_ptr(&local_558);
  std::make_unique<slang::ast::builtins::PastFunc>();
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::PastFunc,std::default_delete<slang::ast::builtins::PastFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_560,&local_568);
  Compilation::addSystemSubroutine(c,&local_560);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_560);
  std::
  unique_ptr<slang::ast::builtins::PastFunc,_std::default_delete<slang::ast::builtins::PastFunc>_>::
  ~unique_ptr(&local_568);
  pTVar1 = Compilation::getBitType(c);
  local_57c._0_4_ = 0;
  local_598.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_598);
  local_599 = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[10],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
            ((char (*) [10])(local_57c + 4),(Type *)"triggered",(int *)pTVar1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_57c,(bool *)&local_598);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::NonConstantFunction,std::default_delete<slang::ast::NonConstantFunction>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_570,
             (unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
              *)(local_57c + 4));
  Compilation::addSystemMethod(c,EventType,&local_570);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_570);
  std::
  unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
  ::~unique_ptr((unique_ptr<slang::ast::NonConstantFunction,_std::default_delete<slang::ast::NonConstantFunction>_>
                 *)(local_57c + 4));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (&local_598);
  std::make_unique<slang::ast::builtins::RandModeFunc,char_const(&)[10]>((char (*) [10])&local_5b0);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::RandModeFunc,std::default_delete<slang::ast::builtins::RandModeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_5a8,&local_5b0);
  Compilation::addSystemMethod(c,ClassProperty,&local_5a8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_5a8);
  std::
  unique_ptr<slang::ast::builtins::RandModeFunc,_std::default_delete<slang::ast::builtins::RandModeFunc>_>
  ::~unique_ptr(&local_5b0);
  std::make_unique<slang::ast::builtins::RandModeFunc,char_const(&)[16]>((char (*) [16])&local_5c0);
  std::unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>::
  unique_ptr<slang::ast::builtins::RandModeFunc,std::default_delete<slang::ast::builtins::RandModeFunc>,void>
            ((unique_ptr<slang::ast::SystemSubroutine,std::default_delete<slang::ast::SystemSubroutine>>
              *)&local_5b8,&local_5c0);
  Compilation::addSystemMethod(c,ConstraintBlock,&local_5b8);
  std::unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  ::~unique_ptr(&local_5b8);
  std::
  unique_ptr<slang::ast::builtins::RandModeFunc,_std::default_delete<slang::ast::builtins::RandModeFunc>_>
  ::~unique_ptr(&local_5c0);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)local_38
            );
  return;
}

Assistant:

void registerNonConstFuncs(Compilation& c) {
#define REGISTER(...) c.addSystemSubroutine(std::make_unique<NonConstantFunction>(__VA_ARGS__))

    auto& intType = c.getIntType();
    auto& uintType = c.getUnsignedIntType();
    std::vector<const Type*> intArg = {&intType};

    REGISTER("$time", c.getType(SyntaxKind::TimeType));
    REGISTER("$stime", c.getUnsignedIntType());
    REGISTER("$realtime", c.getType(SyntaxKind::RealTimeType));
    REGISTER("$random", intType, 0, intArg);
    REGISTER("$urandom", uintType, 0, intArg);
    REGISTER("$urandom_range", uintType, 1, std::vector<const Type*>{&uintType, &uintType});

    REGISTER("$fopen", intType, 1, std::vector{&c.getStringType(), &c.getStringType()});
    REGISTER("$fclose", c.getVoidType(), 1, intArg);
    REGISTER("$fgetc", intType, 1, intArg);
    REGISTER("$ungetc", intType, 2, std::vector{&intType, &intType});
    REGISTER("$ftell", intType, 1, intArg);
    REGISTER("$fseek", intType, 3, std::vector{&intType, &intType, &intType});
    REGISTER("$rewind", intType, 1, intArg);
    REGISTER("$fflush", c.getVoidType(), 0, intArg);
    REGISTER("$feof", intType, 1, intArg);

    REGISTER("$test$plusargs", intType, 1, std::vector{&c.getStringType()});

#undef REGISTER

#define FUNC(name, numArgs) c.addSystemSubroutine(std::make_unique<DistributionFunc>(name, numArgs))
    FUNC("$dist_uniform", 3);
    FUNC("$dist_normal", 3);
    FUNC("$dist_exponential", 2);
    FUNC("$dist_poisson", 2);
    FUNC("$dist_chi_square", 2);
    FUNC("$dist_t", 2);
    FUNC("$dist_erlang", 3);
#undef FUNC

#define FUNC(name) c.addSystemSubroutine(std::make_unique<ValueChangeFunc>(name))
    FUNC("$rose");
    FUNC("$fell");
    FUNC("$stable");
    FUNC("$changed");
#undef FUNC

#define FUNC(name, isFuture) \
    c.addSystemSubroutine(std::make_unique<GlobalValueChangeFunc>(name, isFuture))
    FUNC("$past_gclk", false);
    FUNC("$rose_gclk", false);
    FUNC("$fell_gclk", false);
    FUNC("$stable_gclk", false);
    FUNC("$changed_gclk", false);
    FUNC("$future_gclk", true);
    FUNC("$rising_gclk", true);
    FUNC("$falling_gclk", true);
    FUNC("$steady_gclk", true);
    FUNC("$changing_gclk", true);
#undef FUNC

    c.addSystemSubroutine(std::make_unique<FErrorFunc>());
    c.addSystemSubroutine(std::make_unique<FGetsFunc>());
    c.addSystemSubroutine(std::make_unique<ScanfFunc>(true));
    c.addSystemSubroutine(std::make_unique<ScanfFunc>(false));
    c.addSystemSubroutine(std::make_unique<FReadFunc>());
    c.addSystemSubroutine(std::make_unique<SampledFunc>());
    c.addSystemSubroutine(std::make_unique<PastFunc>());

    c.addSystemMethod(SymbolKind::EventType,
                      std::make_unique<NonConstantFunction>("triggered", c.getBitType(), 0,
                                                            std::vector<const Type*>{},
                                                            /* isMethod */ true));

    c.addSystemMethod(SymbolKind::ClassProperty, std::make_unique<RandModeFunc>("rand_mode"));
    c.addSystemMethod(SymbolKind::ConstraintBlock,
                      std::make_unique<RandModeFunc>("constraint_mode"));
}